

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                 *this,GetterYs<unsigned_long_long> *getter1,GetterYRef *getter2,
                TransformerLogLin *transformer,ImU32 col)

{
  unsigned_long_long uVar1;
  double dVar2;
  int iVar3;
  ImPlotPlot *pIVar4;
  GetterYRef *pGVar5;
  TransformerLogLin *pTVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  double dVar9;
  double dVar10;
  ImPlotContext *pIVar11;
  int iVar12;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar3 = getter1->Count;
  iVar12 = getter2->Count;
  if (iVar3 < getter2->Count) {
    iVar12 = iVar3;
  }
  this->Prims = iVar12 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar11 = GImPlot;
  (this->P12).y = 0.0;
  uVar1 = *(unsigned_long_long *)
           ((long)getter1->Ys +
           (long)((getter1->Offset % iVar3 + iVar3) % iVar3) * (long)getter1->Stride);
  dVar9 = log10((getter1->XScale * 0.0 + getter1->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar4 = pIVar11->CurrentPlot;
  dVar2 = (pIVar4->XAxis).Range.Min;
  iVar3 = transformer->YAxis;
  IVar7.y = (float)(((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) -
                    pIVar4->YAxis[iVar3].Range.Min) * pIVar11->My[iVar3] +
                   (double)pIVar11->PixelRange[iVar3].Min.y);
  IVar7.x = (float)((((double)(float)(dVar9 / pIVar11->LogDenX) *
                      ((pIVar4->XAxis).Range.Max - dVar2) + dVar2) - dVar2) * pIVar11->Mx +
                   (double)pIVar11->PixelRange[iVar3].Min.x);
  this->P11 = IVar7;
  pIVar11 = GImPlot;
  pGVar5 = this->Getter2;
  pTVar6 = this->Transformer;
  dVar2 = pGVar5->YRef;
  dVar10 = log10((pGVar5->XScale * 0.0 + pGVar5->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar4 = pIVar11->CurrentPlot;
  dVar9 = (pIVar4->XAxis).Range.Min;
  iVar3 = pTVar6->YAxis;
  IVar8.y = (float)((dVar2 - pIVar4->YAxis[iVar3].Range.Min) * pIVar11->My[iVar3] +
                   (double)pIVar11->PixelRange[iVar3].Min.y);
  IVar8.x = (float)((((double)(float)(dVar10 / pIVar11->LogDenX) *
                      ((pIVar4->XAxis).Range.Max - dVar9) + dVar9) - dVar9) * pIVar11->Mx +
                   (double)pIVar11->PixelRange[iVar3].Min.x);
  this->P12 = IVar8;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }